

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O2

Time absl::lts_20250127::Now(void)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Time TVar3;
  Duration DVar4;
  
  uVar2 = GetCurrentTimeNanos();
  if (-1 < (long)uVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    TVar3.rep_.rep_hi_ = (HiRep)(uVar2 / 1000000000);
    TVar3.rep_.rep_lo_ = SUB164(auVar1 % ZEXT816(1000000000),0) << 2;
    return (Time)TVar3.rep_;
  }
  DVar4 = time_internal::FromInt64<1000000000l>(uVar2);
  return (Time)DVar4;
}

Assistant:

ABSL_NAMESPACE_BEGIN
Time Now() {
  // TODO(bww): Get a timespec instead so we don't have to divide.
  int64_t n = absl::GetCurrentTimeNanos();
  if (n >= 0) {
    return time_internal::FromUnixDuration(
        time_internal::MakeDuration(n / 1000000000, n % 1000000000 * 4));
  }
  return time_internal::FromUnixDuration(absl::Nanoseconds(n));
}